

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  void **ppvVar1;
  int iVar2;
  Rep *pRVar3;
  LogMessage *other;
  long lVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar2 = this->current_size_;
  if ((long)iVar2 < 0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x60a);
    other = LogMessage::operator<<(&local_50,"CHECK failed: (n) >= (0): ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
  }
  if (0 < iVar2) {
    pRVar3 = this->rep_;
    lVar4 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar4;
      lVar4 = lVar4 + 1;
      *(undefined4 *)((long)*ppvVar1 + 0x10) = 0;
    } while (iVar2 != lVar4);
    this->current_size_ = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}